

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitBlock
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Block *curr)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  Expression **ppEVar4;
  reference ppBVar5;
  size_type sVar6;
  bool local_f9;
  Flow local_c0;
  ulong local_78;
  size_t i;
  ExpressionList *list;
  Block *pBStack_60;
  value_type local_50;
  Block *top;
  undefined1 local_38 [8];
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> stack;
  Block *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  Flow *flow;
  
  stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::vector
            ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38);
  std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
            ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38,
             (value_type *)
             &stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_f9 = false;
    if (sVar3 != 0) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
      local_f9 = Expression::is<wasm::Block>(*ppEVar4);
    }
    if (local_f9 == false) break;
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
    stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Expression::cast<wasm::Block>(*ppEVar4);
    std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
              ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38,
               (value_type *)
               &stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  top._3_1_ = 0;
  Flow::Flow(__return_storage_ptr__);
  ppBVar5 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::back
                      ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38);
  local_50 = *ppBVar5;
  do {
    while( true ) {
      sVar6 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::size
                        ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38);
      if (sVar6 == 0) {
        top._3_1_ = 1;
        std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::~vector
                  ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38);
        return __return_storage_ptr__;
      }
      ppBVar5 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::back
                          ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38);
      stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppBVar5;
      std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::pop_back
                ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)local_38);
      bVar2 = Flow::breaking(__return_storage_ptr__);
      if (!bVar2) break;
      list = *(ExpressionList **)
              &((IString *)
               (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 2))->str;
      pBStack_60 = stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[3];
      Flow::clearIf(__return_storage_ptr__,
                    (Name)((IString *)
                          (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 2))->str);
    }
    i = (size_t)(stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4);
    for (local_78 = 0; uVar1 = local_78,
        sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)i
                          ), uVar1 < sVar3; local_78 = local_78 + 1) {
      if (((value_type)
           stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == local_50) || (local_78 != 0)) {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )i,local_78);
        visit(&local_c0,this,*ppEVar4);
        Flow::operator=(__return_storage_ptr__,&local_c0);
        Flow::~Flow(&local_c0);
        bVar2 = Flow::breaking(__return_storage_ptr__);
        if (bVar2) {
          Flow::clearIf(__return_storage_ptr__,
                        (Name)((IString *)
                              (stack.
                               super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 2))->str);
          break;
        }
      }
    }
  } while( true );
}

Assistant:

Flow visitBlock(Block* curr) {
    NOTE_ENTER("Block");
    // special-case Block, because Block nesting (in their first element) can be
    // incredibly deep
    std::vector<Block*> stack;
    stack.push_back(curr);
    while (curr->list.size() > 0 && curr->list[0]->is<Block>()) {
      curr = curr->list[0]->cast<Block>();
      stack.push_back(curr);
    }
    Flow flow;
    auto* top = stack.back();
    while (stack.size() > 0) {
      curr = stack.back();
      stack.pop_back();
      if (flow.breaking()) {
        flow.clearIf(curr->name);
        continue;
      }
      auto& list = curr->list;
      for (size_t i = 0; i < list.size(); i++) {
        if (curr != top && i == 0) {
          // one of the block recursions we already handled
          continue;
        }
        flow = visit(list[i]);
        if (flow.breaking()) {
          flow.clearIf(curr->name);
          break;
        }
      }
    }
    return flow;
  }